

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_critical_rate_simulation.cpp
# Opt level: O2

void configure_parser(Parser *parser)

{
  allocator<char> local_6b;
  allocator<char> local_6a;
  allocator<char> local_69;
  string local_68;
  string local_48;
  string local_28;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"s",&local_69);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"seed",&local_6a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,
             "Mersenne Twister seed. Used to generate random bit-strings and simulate the noise channel."
             ,&local_6b);
  cli::Parser::set_optional<unsigned_long>(parser,&local_28,&local_48,0x2a,&local_68,false);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"upn",&local_69);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"update-console-n-frames",&local_6a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"Update console output every n frames",&local_6b);
  cli::Parser::set_optional<unsigned_long>(parser,&local_28,&local_48,100,&local_68,false);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"nf",&local_69);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"num-frames-to-test",&local_6a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"Number of frames to test (find optimal rate for).",&local_6b);
  cli::Parser::set_optional<unsigned_long>(parser,&local_28,&local_48,1,&local_68,false);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"i",&local_69);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"iter-bp",&local_6a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"Maximum number of belief propagation (BP) algorithm iterations.",
             &local_6b);
  cli::Parser::set_optional<unsigned_long>(parser,&local_28,&local_48,0x32,&local_68,false);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"me",&local_69);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"max-frame-errors",&local_6a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,
             "Number of frame errors at which to quit the simulation. Specify zero for \'no condition\'."
             ,&local_6b);
  cli::Parser::set_optional<unsigned_long>(parser,&local_28,&local_48,0x32,&local_68,false);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"p",&local_69);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"channel-parameter",&local_6a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,
             "Binary Symmetric Channel (BSC) channel parameter. I.e., probability of a bit to be flipped."
             ,&local_6b);
  cli::Parser::set_optional<double>(parser,&local_28,&local_48,0.02,&local_68,false);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"cp",&local_69);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"code-path",&local_6a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,
             "Path to file containing LDPC code (`.cscmat` or `.bincsc.json` format. Note: does not accept QC exponents!)"
             ,&local_6b);
  cli::Parser::set_required<std::__cxx11::string>(parser,&local_28,&local_48,&local_68,false);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"rp",&local_69);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"rate-adaption-path",&local_6a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,
             "Path to file containing rate adaption for the LDPC code (`csv` format. Two columns of indices)."
             ,&local_6b);
  cli::Parser::set_required<std::__cxx11::string>(parser,&local_28,&local_48,&local_68,false);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  return;
}

Assistant:

void configure_parser(cli::Parser &parser) {
    parser.set_optional<std::size_t>(
            "s", "seed", 42,
            "Mersenne Twister seed. Used to generate random bit-strings and simulate the noise channel.");

    parser.set_optional<std::size_t>(
            "upn", "update-console-n-frames", 100,
            "Update console output every n frames");

    parser.set_optional<std::size_t>(
            "nf", "num-frames-to-test", 1,
            "Number of frames to test (find optimal rate for).");

    parser.set_optional<std::size_t>(
            "i", "iter-bp", 50,
            "Maximum number of belief propagation (BP) algorithm iterations.");

    parser.set_optional<std::size_t>(
            "me", "max-frame-errors", 50,
            "Number of frame errors at which to quit the simulation. Specify zero for 'no condition'.");

    parser.set_optional<double>(
            "p", "channel-parameter", 0.02,
            "Binary Symmetric Channel (BSC) channel parameter. I.e., probability of a bit to be flipped.");

    parser.set_required<std::string>(
            "cp", "code-path",
            "Path to file containing LDPC code (`.cscmat` or `.bincsc.json` format. Note: does not accept QC exponents!)");

    parser.set_required<std::string>(
            "rp", "rate-adaption-path",
            "Path to file containing rate adaption for the LDPC code (`csv` format. Two columns of indices).");
}